

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O3

char * luaL_prepbuffsize(luaL_Buffer *B,size_t sz)

{
  lua_State *L;
  ulong uVar1;
  int iVar2;
  char *__dest;
  undefined8 *puVar3;
  ulong uVar4;
  ulong newsize;
  
  uVar4 = B->n;
  if (B->size - uVar4 < sz) {
    uVar1 = B->size * 2;
    newsize = uVar4 + sz;
    if (sz <= uVar1 - uVar4) {
      newsize = uVar1;
    }
    L = B->L;
    if (!(bool)(~(newsize < uVar4) & sz <= newsize - uVar4)) {
      luaL_error(L,"buffer too large");
    }
    if (B->b == B->initb) {
      puVar3 = (undefined8 *)lua_newuserdata(L,0x10);
      *puVar3 = 0;
      puVar3[1] = 0;
      iVar2 = luaL_newmetatable(L,"LUABOX");
      if (iVar2 != 0) {
        lua_pushcclosure(L,boxgc,0);
        lua_setfield(L,-2,"__gc");
      }
      lua_setmetatable(L,-2);
      __dest = (char *)resizebox(L,-1,newsize);
      memcpy(__dest,B->b,B->n);
    }
    else {
      __dest = (char *)resizebox(L,-1,newsize);
    }
    B->b = __dest;
    B->size = newsize;
    uVar4 = B->n;
  }
  else {
    __dest = B->b;
  }
  return __dest + uVar4;
}

Assistant:

LUALIB_API char *luaL_prepbuffsize (luaL_Buffer *B, size_t sz) {
  lua_State *L = B->L;
  if (B->size - B->n < sz) {  /* not enough space? */
    char *newbuff;
    size_t newsize = B->size * 2;  /* double buffer size */
    if (newsize - B->n < sz)  /* not big enough? */
      newsize = B->n + sz;
    if (newsize < B->n || newsize - B->n < sz)
      luaL_error(L, "buffer too large");
    /* create larger buffer */
    if (buffonstack(B))
      newbuff = (char *)resizebox(L, -1, newsize);
    else {  /* no buffer yet */
      newbuff = (char *)newbox(L, newsize);
      memcpy(newbuff, B->b, B->n * sizeof(char));  /* copy original content */
    }
    B->b = newbuff;
    B->size = newsize;
  }
  return &B->b[B->n];
}